

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitutils.h
# Opt level: O2

size_t spvtools::utils::CountSetBits<unsigned_int>(uint word)

{
  uint32_t count;
  
  count = 0;
  for (; word != 0; word = word - 1 & word) {
    count = count + 1;
  }
  return (ulong)count;
}

Assistant:

size_t CountSetBits(T word) {
  static_assert(std::is_integral<T>::value,
                "CountSetBits requires integer type");
  uint32_t count = 0;
  while (word) {
    word &= word - 1;
    ++count;
  }
  return count;
}